

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::ReFinalizeNode,_void>::visit
          (Visitor<wasm::ReFinalizeNode,_void> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::ReFinalizeNode,_void> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ReFinalizeNode::visitBlock((ReFinalizeNode *)this,(Block *)curr);
      break;
    case IfId:
      ReFinalizeNode::visitIf((ReFinalizeNode *)this,(If *)curr);
      break;
    case LoopId:
      ReFinalizeNode::visitLoop((ReFinalizeNode *)this,(Loop *)curr);
      break;
    case BreakId:
      ReFinalizeNode::visitBreak((ReFinalizeNode *)this,(Break *)curr);
      break;
    case SwitchId:
      ReFinalizeNode::visitSwitch((ReFinalizeNode *)this,(Switch *)curr);
      break;
    case CallId:
      ReFinalizeNode::visitCall((ReFinalizeNode *)this,(Call *)curr);
      break;
    case CallIndirectId:
      ReFinalizeNode::visitCallIndirect((ReFinalizeNode *)this,(CallIndirect *)curr);
      break;
    case LocalGetId:
      ReFinalizeNode::visitLocalGet((ReFinalizeNode *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      ReFinalizeNode::visitLocalSet((ReFinalizeNode *)this,(LocalSet *)curr);
      break;
    case GlobalGetId:
      ReFinalizeNode::visitGlobalGet((ReFinalizeNode *)this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      ReFinalizeNode::visitGlobalSet((ReFinalizeNode *)this,(GlobalSet *)curr);
      break;
    case LoadId:
      ReFinalizeNode::visitLoad((ReFinalizeNode *)this,(Load *)curr);
      break;
    case StoreId:
      ReFinalizeNode::visitStore((ReFinalizeNode *)this,(Store *)curr);
      break;
    case ConstId:
      ReFinalizeNode::visitConst((ReFinalizeNode *)this,(Const *)curr);
      break;
    case UnaryId:
      ReFinalizeNode::visitUnary((ReFinalizeNode *)this,(Unary *)curr);
      break;
    case BinaryId:
      ReFinalizeNode::visitBinary((ReFinalizeNode *)this,(Binary *)curr);
      break;
    case SelectId:
      ReFinalizeNode::visitSelect((ReFinalizeNode *)this,(Select *)curr);
      break;
    case DropId:
      ReFinalizeNode::visitDrop((ReFinalizeNode *)this,(Drop *)curr);
      break;
    case ReturnId:
      ReFinalizeNode::visitReturn((ReFinalizeNode *)this,(Return *)curr);
      break;
    case MemorySizeId:
      ReFinalizeNode::visitMemorySize((ReFinalizeNode *)this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      ReFinalizeNode::visitMemoryGrow((ReFinalizeNode *)this,(MemoryGrow *)curr);
      break;
    case NopId:
      ReFinalizeNode::visitNop((ReFinalizeNode *)this,(Nop *)curr);
      break;
    case UnreachableId:
      ReFinalizeNode::visitUnreachable((ReFinalizeNode *)this,(Unreachable *)curr);
      break;
    case AtomicRMWId:
      ReFinalizeNode::visitAtomicRMW((ReFinalizeNode *)this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      ReFinalizeNode::visitAtomicCmpxchg((ReFinalizeNode *)this,(AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      ReFinalizeNode::visitAtomicWait((ReFinalizeNode *)this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      ReFinalizeNode::visitAtomicNotify((ReFinalizeNode *)this,(AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      ReFinalizeNode::visitAtomicFence((ReFinalizeNode *)this,(AtomicFence *)curr);
      break;
    case SIMDExtractId:
      ReFinalizeNode::visitSIMDExtract((ReFinalizeNode *)this,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      ReFinalizeNode::visitSIMDReplace((ReFinalizeNode *)this,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      ReFinalizeNode::visitSIMDShuffle((ReFinalizeNode *)this,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      ReFinalizeNode::visitSIMDTernary((ReFinalizeNode *)this,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      ReFinalizeNode::visitSIMDShift((ReFinalizeNode *)this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      ReFinalizeNode::visitSIMDLoad((ReFinalizeNode *)this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      ReFinalizeNode::visitSIMDLoadStoreLane((ReFinalizeNode *)this,(SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      ReFinalizeNode::visitMemoryInit((ReFinalizeNode *)this,(MemoryInit *)curr);
      break;
    case DataDropId:
      ReFinalizeNode::visitDataDrop((ReFinalizeNode *)this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      ReFinalizeNode::visitMemoryCopy((ReFinalizeNode *)this,(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      ReFinalizeNode::visitMemoryFill((ReFinalizeNode *)this,(MemoryFill *)curr);
      break;
    case PopId:
      ReFinalizeNode::visitPop((ReFinalizeNode *)this,(Pop *)curr);
      break;
    case RefNullId:
      ReFinalizeNode::visitRefNull((ReFinalizeNode *)this,(RefNull *)curr);
      break;
    case RefIsNullId:
      ReFinalizeNode::visitRefIsNull((ReFinalizeNode *)this,(RefIsNull *)curr);
      break;
    case RefFuncId:
      ReFinalizeNode::visitRefFunc((ReFinalizeNode *)this,(RefFunc *)curr);
      break;
    case RefEqId:
      ReFinalizeNode::visitRefEq((ReFinalizeNode *)this,(RefEq *)curr);
      break;
    case TableGetId:
      ReFinalizeNode::visitTableGet((ReFinalizeNode *)this,(TableGet *)curr);
      break;
    case TableSetId:
      ReFinalizeNode::visitTableSet((ReFinalizeNode *)this,(TableSet *)curr);
      break;
    case TableSizeId:
      ReFinalizeNode::visitTableSize((ReFinalizeNode *)this,(TableSize *)curr);
      break;
    case TableGrowId:
      ReFinalizeNode::visitTableGrow((ReFinalizeNode *)this,(TableGrow *)curr);
      break;
    case TryId:
      ReFinalizeNode::visitTry((ReFinalizeNode *)this,(Try *)curr);
      break;
    case ThrowId:
      ReFinalizeNode::visitThrow((ReFinalizeNode *)this,(Throw *)curr);
      break;
    case RethrowId:
      ReFinalizeNode::visitRethrow((ReFinalizeNode *)this,(Rethrow *)curr);
      break;
    case TupleMakeId:
      ReFinalizeNode::visitTupleMake((ReFinalizeNode *)this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      ReFinalizeNode::visitTupleExtract((ReFinalizeNode *)this,(TupleExtract *)curr);
      break;
    case I31NewId:
      ReFinalizeNode::visitI31New((ReFinalizeNode *)this,(I31New *)curr);
      break;
    case I31GetId:
      ReFinalizeNode::visitI31Get((ReFinalizeNode *)this,(I31Get *)curr);
      break;
    case CallRefId:
      ReFinalizeNode::visitCallRef((ReFinalizeNode *)this,(CallRef *)curr);
      break;
    case RefTestId:
      ReFinalizeNode::visitRefTest((ReFinalizeNode *)this,(RefTest *)curr);
      break;
    case RefCastId:
      ReFinalizeNode::visitRefCast((ReFinalizeNode *)this,(RefCast *)curr);
      break;
    case BrOnId:
      ReFinalizeNode::visitBrOn((ReFinalizeNode *)this,(BrOn *)curr);
      break;
    case StructNewId:
      ReFinalizeNode::visitStructNew((ReFinalizeNode *)this,(StructNew *)curr);
      break;
    case StructGetId:
      ReFinalizeNode::visitStructGet((ReFinalizeNode *)this,(StructGet *)curr);
      break;
    case StructSetId:
      ReFinalizeNode::visitStructSet((ReFinalizeNode *)this,(StructSet *)curr);
      break;
    case ArrayNewId:
      ReFinalizeNode::visitArrayNew((ReFinalizeNode *)this,(ArrayNew *)curr);
      break;
    case ArrayNewSegId:
      ReFinalizeNode::visitArrayNewSeg((ReFinalizeNode *)this,(ArrayNewSeg *)curr);
      break;
    case ArrayNewFixedId:
      ReFinalizeNode::visitArrayNewFixed((ReFinalizeNode *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      ReFinalizeNode::visitArrayGet((ReFinalizeNode *)this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      ReFinalizeNode::visitArraySet((ReFinalizeNode *)this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      ReFinalizeNode::visitArrayLen((ReFinalizeNode *)this,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      ReFinalizeNode::visitArrayCopy((ReFinalizeNode *)this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      ReFinalizeNode::visitArrayFill((ReFinalizeNode *)this,(ArrayFill *)curr);
      break;
    case ArrayInitId:
      ReFinalizeNode::visitArrayInit((ReFinalizeNode *)this,(ArrayInit *)curr);
      break;
    case RefAsId:
      ReFinalizeNode::visitRefAs((ReFinalizeNode *)this,(RefAs *)curr);
      break;
    case StringNewId:
      ReFinalizeNode::visitStringNew((ReFinalizeNode *)this,(StringNew *)curr);
      break;
    case StringConstId:
      ReFinalizeNode::visitStringConst((ReFinalizeNode *)this,(StringConst *)curr);
      break;
    case StringMeasureId:
      ReFinalizeNode::visitStringMeasure((ReFinalizeNode *)this,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      ReFinalizeNode::visitStringEncode((ReFinalizeNode *)this,(StringEncode *)curr);
      break;
    case StringConcatId:
      ReFinalizeNode::visitStringConcat((ReFinalizeNode *)this,(StringConcat *)curr);
      break;
    case StringEqId:
      ReFinalizeNode::visitStringEq((ReFinalizeNode *)this,(StringEq *)curr);
      break;
    case StringAsId:
      ReFinalizeNode::visitStringAs((ReFinalizeNode *)this,(StringAs *)curr);
      break;
    case StringWTF8AdvanceId:
      ReFinalizeNode::visitStringWTF8Advance((ReFinalizeNode *)this,(StringWTF8Advance *)curr);
      break;
    case StringWTF16GetId:
      ReFinalizeNode::visitStringWTF16Get((ReFinalizeNode *)this,(StringWTF16Get *)curr);
      break;
    case StringIterNextId:
      ReFinalizeNode::visitStringIterNext((ReFinalizeNode *)this,(StringIterNext *)curr);
      break;
    case StringIterMoveId:
      ReFinalizeNode::visitStringIterMove((ReFinalizeNode *)this,(StringIterMove *)curr);
      break;
    case StringSliceWTFId:
      ReFinalizeNode::visitStringSliceWTF((ReFinalizeNode *)this,(StringSliceWTF *)curr);
      break;
    case StringSliceIterId:
      ReFinalizeNode::visitStringSliceIter((ReFinalizeNode *)this,(StringSliceIter *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                         ,0x45);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                ,0x3a,
                "ReturnType wasm::Visitor<wasm::ReFinalizeNode>::visit(Expression *) [SubType = wasm::ReFinalizeNode, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }